

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DateTime.h
# Opt level: O0

void __thiscall libsgp4::DateTime::FromTicks(DateTime *this,int *year,int *month,int *day)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 *local_48;
  int *daysInMonthPtr;
  int num1;
  int num4;
  int num100;
  int num400;
  int totalDays;
  int *day_local;
  int *month_local;
  int *year_local;
  DateTime *this_local;
  
  iVar2 = (int)(this->m_encoded / 86400000000);
  iVar3 = iVar2 % 0x23ab1;
  num1 = iVar3 / 0x8eac;
  if (num1 == 4) {
    num1 = 3;
  }
  iVar3 = iVar3 + num1 * -0x8eac;
  iVar4 = iVar3 % 0x5b5;
  daysInMonthPtr._4_4_ = iVar4 / 0x16d;
  if (daysInMonthPtr._4_4_ == 4) {
    daysInMonthPtr._4_4_ = 3;
  }
  num100 = iVar4 + daysInMonthPtr._4_4_ * -0x16d;
  *year = (iVar2 / 0x23ab1) * 400 + num1 * 100 + (iVar3 / 0x5b5) * 4 + daysInMonthPtr._4_4_ + 1;
  bVar1 = IsLeapYear(*year);
  if (bVar1) {
    local_48 = (undefined1 *)0x115284;
  }
  else {
    local_48 = (anonymous_namespace)::daysInMonth;
  }
  *month = 1;
  while( true ) {
    bVar1 = false;
    if (*(int *)(local_48 + (long)*month * 4) <= num100) {
      bVar1 = *month < 0xd;
    }
    if (!bVar1) break;
    iVar2 = *month;
    *month = iVar2 + 1;
    num100 = num100 - *(int *)(local_48 + (long)iVar2 * 4);
  }
  *day = num100 + 1;
  return;
}

Assistant:

void FromTicks(int& year, int& month, int& day) const
    {
        int totalDays = static_cast<int>(m_encoded / TicksPerDay);
        
        /*
         * number of 400 year cycles
         */
        int num400 = totalDays / 146097;
        totalDays -= num400 * 146097;
        /*
         * number of 100 year cycles
         */
        int num100 = totalDays / 36524;
        if (num100 == 4)
        {
            /*
             * last day of the last leap century
             */
            num100 = 3;
        }
        totalDays -= num100 * 36524;
        /*
         * number of 4 year cycles
         */
        int num4 = totalDays / 1461;
        totalDays -= num4 * 1461;
        /*
         * number of years
         */
        int num1 = totalDays / 365;
        if (num1 == 4)
        {
            /*
             * last day of the last leap olympiad
             */
            num1 = 3;
        }
        totalDays -= num1 * 365;

        /*
         * find year
         */
        year = (num400 * 400) + (num100 * 100) + (num4 * 4) + num1 + 1;
        
        /*
         * convert day of year to month/day
         */
        const int* daysInMonthPtr;
        if (IsLeapYear(year))
        {
            daysInMonthPtr = daysInMonth[1];
        }
        else
        {
            daysInMonthPtr = daysInMonth[0];
        }

        month = 1;
        while (totalDays >= daysInMonthPtr[month] && month <= 12)
        {
            totalDays -= daysInMonthPtr[month++];
        }

        day = totalDays + 1;
    }